

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCII16kb.hpp
# Opt level: O1

ssize_t __thiscall
MSX::Cartridge::ASCII16kbROMSlotHandler::write
          (ASCII16kbROMSlotHandler *this,int __fd,void *__buf,size_t __n)

{
  ConfidenceCounter *this_00;
  uint uVar1;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  char cVar2;
  uint16_t destination_address;
  MemorySlot *this_01;
  
  uVar1 = (uint)__fd >> 0xb;
  cVar2 = (char)__n;
  if ((short)uVar1 == 0xc) {
    if (cVar2 != '\0') {
      this_00 = &(this->super_MemorySlotHandler).confidence_counter_;
      if ((__fd & 0xffffU) == 0x6000) {
        Analyser::Dynamic::ConfidenceCounter::add_hit(this_00);
      }
      else {
        Analyser::Dynamic::ConfidenceCounter::add_equivocal(this_00);
      }
    }
    this_01 = this->slot_;
    destination_address = 0x4000;
  }
  else {
    if (uVar1 != 0xe) {
      if (cVar2 != '\0') {
        Analyser::Dynamic::ConfidenceCounter::add_miss
                  (&(this->super_MemorySlotHandler).confidence_counter_);
        return extraout_RAX;
      }
      return (ulong)uVar1;
    }
    if (cVar2 != '\0') {
      if (((__fd & 0xffffU) == 0x77ff) || ((__fd & 0xffffU) == 0x7000)) {
        Analyser::Dynamic::ConfidenceCounter::add_hit
                  (&(this->super_MemorySlotHandler).confidence_counter_);
      }
      else {
        Analyser::Dynamic::ConfidenceCounter::add_equivocal
                  (&(this->super_MemorySlotHandler).confidence_counter_);
      }
    }
    this_01 = this->slot_;
    destination_address = 0x8000;
  }
  MemorySlot::map<(MSX::MemorySlot::AccessType)0>
            (this_01,(ulong)(((uint)__buf & 0xff) << 0xe),destination_address,0x4000);
  return extraout_RAX_00;
}

Assistant:

void write(uint16_t address, uint8_t value, bool pc_is_outside_bios) final {
			switch(address >> 11) {
				default:
					if(pc_is_outside_bios) confidence_counter_.add_miss();
				break;
				case 0xc:
					if(pc_is_outside_bios) {
						if(address == 0x6000) confidence_counter_.add_hit(); else confidence_counter_.add_equivocal();
					}
					slot_.map(value * 0x4000, 0x4000, 0x4000);
				break;
				case 0xe:
					if(pc_is_outside_bios) {
						if(address == 0x7000 || address == 0x77ff) confidence_counter_.add_hit(); else confidence_counter_.add_equivocal();
					}
					slot_.map(value * 0x4000, 0x8000, 0x4000);
				break;
			}
		}